

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_structure.cpp
# Opt level: O0

_anonymous_namespace_ * __thiscall
(anonymous_namespace)::
dump<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
          (_anonymous_namespace_ *this,database *db,
          hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          *index,ostream *os,index_pointer node,uint shifts)

{
  bool bVar1;
  address addr;
  uint shifts_local;
  ostream *os_local;
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *index_local;
  database *db_local;
  index_pointer node_local;
  
  db_local = (database *)node;
  node_local = (index_pointer)this;
  bVar1 = pstore::index::details::index_pointer::is_leaf((index_pointer *)&db_local);
  if (bVar1) {
    bVar1 = pstore::index::details::index_pointer::is_address((index_pointer *)&db_local);
    if (!bVar1) {
      pstore::assert_failed
                ("node.is_address ()",
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/index_structure/index_structure.cpp"
                 ,0x89);
    }
    addr = pstore::index::details::index_pointer::to_address((index_pointer *)&db_local);
    dump_leaf<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
              (this,db,index,os,addr);
  }
  else {
    bVar1 = pstore::index::details::depth_is_internal_node(shifts);
    if (bVar1) {
      dump_intermediate<pstore::index::details::internal_node,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                (this,db,index,os,(index_pointer)db_local,shifts);
    }
    else {
      dump_intermediate<pstore::index::details::linear_node,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                (this,db,index,os,(index_pointer)db_local,shifts);
    }
  }
  return this;
}

Assistant:

std::string dump (pstore::database const & db, IndexType const & index, std::ostream & os,
                      index_pointer node, unsigned shifts) {
        if (node.is_leaf ()) {
            PSTORE_ASSERT (node.is_address ());
            return dump_leaf (db, index, os, node.to_address ());
        }
        return depth_is_internal_node (shifts)
                   ? dump_intermediate<internal_node> (db, index, os, node, shifts)
                   : dump_intermediate<linear_node> (db, index, os, node, shifts);
    }